

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O0

bool duckdb_yyjson::is_truncated_end
               (u8 *hdr,u8 *cur,u8 *end,yyjson_read_code code,yyjson_read_flag flg)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  int in_ECX;
  byte *in_RDX;
  byte *in_RSI;
  long in_RDI;
  uint in_R8D;
  bool bVar6;
  u8 pat_2;
  u8 pat_1;
  u8 pat;
  u8 c2;
  u8 c1;
  u8 c0;
  usize len_6;
  usize len_5;
  usize len_4;
  usize len_3;
  usize len_2;
  usize len_1;
  usize len;
  bool local_169;
  bool local_168;
  bool local_167;
  byte *local_148;
  byte *local_110;
  byte *local_100;
  byte *local_e0;
  byte *local_d0;
  byte *local_b0;
  byte *local_a0;
  
  if (in_RDX <= in_RSI) {
    return true;
  }
  if (in_ECX == 0xb) {
    sVar4 = strlen("true");
    if ((in_RDX < in_RSI + sVar4) && (in_RSI < in_RDX)) {
      iVar3 = memcmp(in_RSI,"true",(long)in_RDX - (long)in_RSI);
      bVar6 = iVar3 == 0;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      return true;
    }
    sVar4 = strlen("false");
    if ((in_RDX < in_RSI + sVar4) && (in_RSI < in_RDX)) {
      iVar3 = memcmp(in_RSI,"false",(long)in_RDX - (long)in_RSI);
      bVar6 = iVar3 == 0;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      return true;
    }
    sVar4 = strlen("null");
    if ((in_RDX < in_RSI + sVar4) && (in_RSI < in_RDX)) {
      iVar3 = memcmp(in_RSI,"null",(long)in_RDX - (long)in_RSI);
      bVar6 = iVar3 == 0;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      return true;
    }
  }
  local_148 = in_RSI;
  if ((((in_ECX == 6) || (in_ECX == 9)) || (in_ECX == 0xb)) && ((in_R8D & 0x10) != 0)) {
    if (*in_RSI == 0x2d) {
      local_148 = in_RSI + 1;
    }
    local_a0 = local_148;
    local_b0 = (byte *)0x2ae2df2;
    sVar4 = strlen("infinity");
    if ((in_RDX < local_148 + sVar4) && (local_148 < in_RDX)) {
      for (; local_a0 < in_RDX; local_a0 = local_a0 + 1) {
        if ((*local_a0 != *local_b0) && ((uint)*local_a0 != *local_b0 - 0x20)) {
          bVar6 = false;
          goto LAB_027db73f;
        }
        local_b0 = local_b0 + 1;
      }
      bVar6 = true;
    }
    else {
      bVar6 = false;
    }
LAB_027db73f:
    if (!bVar6) {
      local_d0 = local_148;
      local_e0 = (byte *)0x29dde3c;
      sVar4 = strlen("nan");
      if ((in_RDX < local_148 + sVar4) && (local_148 < in_RDX)) {
        for (; local_e0 = local_e0 + 1, local_d0 < in_RDX; local_d0 = local_d0 + 1) {
          if ((*local_d0 != *local_e0) && ((uint)*local_d0 != *local_e0 - 0x20)) {
            bVar6 = false;
            goto LAB_027db89c;
          }
        }
        bVar6 = true;
      }
      else {
        bVar6 = false;
      }
LAB_027db89c:
      if (!bVar6) goto LAB_027db8b6;
    }
    return true;
  }
LAB_027db8b6:
  if (((in_ECX == 4) && ((in_R8D & 0x10) != 0)) && ((byte *)(in_RDI + 3) <= local_148)) {
    local_100 = local_148 + -3;
    local_110 = (byte *)0x2ae2df2;
    sVar4 = strlen("infinity");
    if ((in_RDX < local_100 + sVar4) && (local_100 < in_RDX)) {
      for (; local_100 < in_RDX; local_100 = local_100 + 1) {
        if ((*local_100 != *local_110) && ((uint)*local_100 != *local_110 - 0x20)) {
          bVar6 = false;
          goto LAB_027dba02;
        }
        local_110 = local_110 + 1;
      }
      bVar6 = true;
    }
    else {
      bVar6 = false;
    }
LAB_027dba02:
    if (bVar6) {
      return true;
    }
  }
  if (in_ECX == 10) {
    uVar5 = (long)in_RDX - (long)local_148;
    if (*local_148 == 0x5c) {
      if (uVar5 == 1) {
        return true;
      }
      if (5 < uVar5) {
        return false;
      }
      if (local_148[1] != 0x75) {
        return false;
      }
      local_148 = local_148 + 2;
      while( true ) {
        if (in_RDX <= local_148) {
          return true;
        }
        if ((char_table[*local_148] & 0x80) == 0) break;
        local_148 = local_148 + 1;
      }
      return false;
    }
    if ((*local_148 & 0x80) != 0) {
      bVar2 = *local_148;
      bVar1 = local_148[1];
      if (uVar5 == 1) {
        if (((bVar2 & 0xe0) == 0xc0) && ((bVar2 & 0x1e) != 0)) {
          return true;
        }
        if ((bVar2 & 0xf0) == 0xe0) {
          return true;
        }
        if (((bVar2 & 0xf8) == 0xf0) && ((bVar2 & 7) < 5)) {
          return true;
        }
      }
      if (uVar5 == 2) {
        if (((bVar2 & 0xf0) == 0xe0) && ((bVar1 & 0xc0) == 0x80)) {
          bVar2 = (bVar2 & 0xf) << 1 | (byte)((int)(bVar1 & 0x20) >> 5);
          local_167 = bVar2 != 0 && bVar2 != 0x1b;
          return local_167;
        }
        if (((bVar2 & 0xf8) == 0xf0) && ((bVar1 & 0xc0) == 0x80)) {
          bVar2 = (bVar2 & 7) << 2 | (byte)((int)(bVar1 & 0x30) >> 4);
          local_168 = bVar2 != 0 && bVar2 < 0x11;
          return local_168;
        }
      }
      if ((((uVar5 == 3) && ((bVar2 & 0xf8) == 0xf0)) && ((bVar1 & 0xc0) == 0x80)) &&
         ((local_148[2] & 0xc0) == 0x80)) {
        bVar2 = (bVar2 & 7) << 2 | (byte)((int)(bVar1 & 0x30) >> 4);
        local_169 = bVar2 != 0 && bVar2 < 0x11;
        return local_169;
      }
    }
  }
  return false;
}

Assistant:

static_noinline bool is_truncated_end(u8 *hdr, u8 *cur, u8 *end,
                                      yyjson_read_code code,
                                      yyjson_read_flag flg) {
    if (cur >= end) return true;
    if (code == YYJSON_READ_ERROR_LITERAL) {
        if (is_truncated_str(cur, end, "true", true) ||
            is_truncated_str(cur, end, "false", true) ||
            is_truncated_str(cur, end, "null", true)) {
            return true;
        }
    }
    if (code == YYJSON_READ_ERROR_UNEXPECTED_CHARACTER ||
        code == YYJSON_READ_ERROR_INVALID_NUMBER ||
        code == YYJSON_READ_ERROR_LITERAL) {
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (*cur == '-') cur++;
            if (is_truncated_str(cur, end, "infinity", false) ||
                is_truncated_str(cur, end, "nan", false)) {
                return true;
            }
        }
    }
    if (code == YYJSON_READ_ERROR_UNEXPECTED_CONTENT) {
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (hdr + 3 <= cur &&
                is_truncated_str(cur - 3, end, "infinity", false)) {
                return true; /* e.g. infin would be read as inf + in */
            }
        }
    }
    if (code == YYJSON_READ_ERROR_INVALID_STRING) {
        usize len = (usize)(end - cur);

        /* unicode escape sequence */
        if (*cur == '\\') {
            if (len == 1) return true;
            if (len <= 5) {
                if (*++cur != 'u') return false;
                for (++cur; cur < end; cur++) {
                    if (!char_is_hex(*cur)) return false;
                }
                return true;
            }
            return false;
        }

        /* 2 to 4 bytes UTF-8, see `read_string()` for details. */
        if (*cur & 0x80) {
            u8 c0 = cur[0], c1 = cur[1], c2 = cur[2];
            if (len == 1) {
                /* 2 bytes UTF-8, truncated */
                if ((c0 & 0xE0) == 0xC0 && (c0 & 0x1E) != 0x00) return true;
                /* 3 bytes UTF-8, truncated */
                if ((c0 & 0xF0) == 0xE0) return true;
                /* 4 bytes UTF-8, truncated */
                if ((c0 & 0xF8) == 0xF0 && (c0 & 0x07) <= 0x04) return true;
            }
            if (len == 2) {
                /* 3 bytes UTF-8, truncated */
                if ((c0 & 0xF0) == 0xE0 &&
                    (c1 & 0xC0) == 0x80) {
                    u8 pat = (u8)(((c0 & 0x0F) << 1) | ((c1 & 0x20) >> 5));
                    return 0x01 <= pat && pat != 0x1B;
                }
                /* 4 bytes UTF-8, truncated */
                if ((c0 & 0xF8) == 0xF0 &&
                    (c1 & 0xC0) == 0x80) {
                    u8 pat = (u8)(((c0 & 0x07) << 2) | ((c1 & 0x30) >> 4));
                    return 0x01 <= pat && pat <= 0x10;
                }
            }
            if (len == 3) {
                /* 4 bytes UTF-8, truncated */
                if ((c0 & 0xF8) == 0xF0 &&
                    (c1 & 0xC0) == 0x80 &&
                    (c2 & 0xC0) == 0x80) {
                    u8 pat = (u8)(((c0 & 0x07) << 2) | ((c1 & 0x30) >> 4));
                    return 0x01 <= pat && pat <= 0x10;
                }
            }
        }
    }
    return false;
}